

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall
TextReaderException::TextReaderException
          (TextReaderException *this,size_t line_index,size_t pos,string *line,string *message)

{
  pointer pcVar1;
  
  this->line_index_ = line_index;
  this->pos_ = pos;
  (this->line_)._M_dataplus._M_p = (pointer)&(this->line_).field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->line_,pcVar1,pcVar1 + line->_M_string_length);
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

TextReaderException(size_t line_index, size_t pos, std::string line, std::string message): line_index_(line_index), pos_(pos), line_(line), message_(message) {}